

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::moveRect(QWidgetPrivate *this,QRect *rect,int dx,int dy)

{
  uint uVar1;
  undefined4 uVar2;
  QWidget *this_00;
  QWidget *this_01;
  QWidgetPrivate *this_02;
  QWExtra *pQVar3;
  ulong uVar4;
  QRect QVar5;
  QRect QVar6;
  bool bVar7;
  char cVar8;
  QWidget *parent;
  QWidgetRepaintManager *this_03;
  Representation RVar9;
  Representation RVar10;
  QRegion *r;
  Representation RVar11;
  Representation RVar12;
  long in_FS_OFFSET;
  QRect QVar13;
  undefined1 auVar14 [16];
  QRegion parentRegion;
  QRegion childExpose;
  QRegion parentExpose;
  QRegion local_f0;
  QRegion local_e8;
  QRegion local_e0;
  QRect local_d8;
  QRect local_c8;
  QRect local_b8;
  QRect local_a8;
  undefined1 local_98 [24];
  QPoint local_80;
  QRegion local_78;
  double local_70;
  double local_68;
  double local_60;
  QRect local_58 [2];
  long local_38;
  
  QVar6._8_8_ = local_58[0]._8_8_;
  QVar6._0_8_ = local_58[0]._0_8_;
  QVar5._8_8_ = local_d8._8_8_;
  QVar5._0_8_ = local_d8._0_8_;
  QVar13._8_8_ = local_b8._8_8_;
  QVar13._0_8_ = local_b8._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((dy == 0 && dx == 0) ||
     (this_00 = *(QWidget **)&this->field_0x8, local_b8 = QVar13, local_d8 = QVar5,
     local_58[0] = QVar6, (this_00->data->widget_attributes & 0x8000) == 0)) goto LAB_003194ed;
  parent = QWidget::window(this_00);
  if (moveRect(QRect_const&,int,int)::accelEnv == '\0') {
    moveRect();
  }
  this_01 = *(QWidget **)(*(long *)&this_00->field_0x8 + 0x10);
  local_58[0].x1.m_i = 0;
  local_58[0].y1.m_i = 0;
  local_80 = QWidget::mapTo(this_01,parent,(QPoint *)local_58);
  this_02 = *(QWidgetPrivate **)&this_01->field_0x8;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_16_ = (undefined1  [16])clipRect(this_02);
  local_a8.x1.m_i = (rect->x1).m_i + dx;
  local_a8.x2.m_i = (rect->x2).m_i + dx;
  local_a8.y1.m_i = (rect->y1).m_i + dy;
  local_a8.y2.m_i = (rect->y2).m_i + dy;
  QVar13 = (QRect)QRect::operator&(rect,(QRect *)local_98);
  RVar9 = QVar13.y1.m_i;
  RVar11 = QVar13.y2.m_i;
  if (RVar9.m_i <= RVar11.m_i && QVar13.x1.m_i.m_i <= QVar13.x2.m_i.m_i) {
    local_58[0].x1.m_i = dx + QVar13.x1.m_i.m_i;
    local_58[0].x2.m_i = dx + QVar13.x2.m_i.m_i;
    local_58[0].y1.m_i = RVar9.m_i + dy;
    local_58[0].y2.m_i = RVar11.m_i + dy;
    local_b8 = QVar13;
    QVar13 = (QRect)QRect::operator&(local_58,(QRect *)local_98);
    RVar9 = QVar13.y1.m_i;
    RVar11 = QVar13.y2.m_i;
  }
  RVar10.m_i = QVar13.x1.m_i.m_i - dx;
  RVar12.m_i = QVar13.x2.m_i.m_i - dx;
  local_c8.y1.m_i = RVar9.m_i - dy;
  local_c8.x1.m_i = RVar10.m_i;
  local_c8.y2.m_i = RVar11.m_i - dy;
  local_c8.x2.m_i = RVar12.m_i;
  local_b8 = QVar13;
  QVar13 = (QRect)QRect::operator&(rect,(QRect *)local_98);
  local_d8 = QVar13;
  if ((this->field_0x253 & 2) == 0) {
    bVar7 = false;
  }
  else {
    bVar7 = hasPlatformWindow(this_00);
  }
  if ((((moveRect::accelEnv == true) && (bVar7 == false && (this->field_0x252 & 2) != 0)) &&
      (RVar10.m_i <= RVar12.m_i)) &&
     ((RVar9.m_i - dy <= RVar11.m_i - dy &&
      (*(long *)(*(long *)(*(long *)&parent->field_0x8 + 0x78) + 0x10) == 0)))) {
    bVar7 = isOverlapped(this,&local_c8);
    if (bVar7) goto LAB_00319349;
    bVar7 = isOverlapped(this,&local_b8);
    if (bVar7) goto LAB_00319349;
    this_03 = maybeRepaintManager(*(QWidgetPrivate **)&parent->field_0x8);
    local_78.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    local_58[0] = (QRect)QRect::operator&(&local_a8,(QRect *)local_98);
    QRegion::QRegion(&local_78,local_58,Rectangle);
    bVar7 = QWidgetRepaintManager::bltRect((QWidgetRepaintManager *)this_03,&local_c8,dx,dy,this_01)
    ;
    if (bVar7) {
      QRegion::QRegion((QRegion *)local_58,&local_b8,Rectangle);
      QRegion::operator-=(&local_78,(QRegion *)local_58);
      QRegion::~QRegion((QRegion *)local_58);
    }
    if ((this_01->data->widget_attributes & 0x400) == 0) {
      uVar1 = this_00->data->widget_attributes;
      if ((uVar1 >> 10 & 1) == 0) {
        cVar8 = QRegion::isEmpty();
        if (cVar8 == '\0') {
          uVar2 = (this->data).crect.x1;
          QRegion::translate((int)&local_78,-uVar2);
          QWidgetRepaintManager::markDirty<QRegion>
                    ((QWidgetRepaintManager *)this_03,&local_78,this_00,UpdateLater,BufferValid);
          this->field_0x252 = this->field_0x252 | 0x20;
        }
      }
      local_58[0]._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion((QRegion *)local_58,&local_d8,Rectangle);
      QRegion::QRegion(&local_e0,&local_a8,Rectangle);
      QRegion::operator-=((QRegion *)local_58,&local_e0);
      QRegion::~QRegion(&local_e0);
      pQVar3 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t
               .super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
      if ((pQVar3 != (QWExtra *)0x0) && ((pQVar3->field_0x7c & 0x80) != 0)) {
        QRegion::QRegion(&local_e8,&local_a8,Rectangle);
        QRegion::translated((int)&local_f0,
                            (int)(this->extra)._M_t.
                                 super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                                 super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                                 super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl + 0x40);
        QRegion::operator-(&local_e0,&local_e8);
        QRegion::operator+=((QRegion *)local_58,&local_e0);
        QRegion::~QRegion(&local_e0);
        QRegion::~QRegion(&local_f0);
        QRegion::~QRegion(&local_e8);
      }
      cVar8 = QRegion::isEmpty();
      if (cVar8 == '\0') {
        QWidgetRepaintManager::markDirty<QRegion>
                  ((QWidgetRepaintManager *)this_03,(QRegion *)local_58,this_01,UpdateLater,
                   BufferValid);
        this_02->field_0x252 = this_02->field_0x252 | 0x20;
      }
      if ((uVar1 >> 10 & 1) == 0) {
        local_e0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion(&local_e0,&local_c8,Rectangle);
        QRegion::operator+=(&local_e0,&local_b8);
        QWidgetRepaintManager::markNeedsFlush
                  ((QWidgetRepaintManager *)this_03,this_01,&local_e0,&local_80);
        QRegion::~QRegion(&local_e0);
      }
      QRegion::~QRegion((QRegion *)local_58);
    }
    r = &local_78;
  }
  else {
LAB_00319349:
    local_e0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    if (this->graphicsEffect != (QGraphicsEffect *)0x0) {
      bVar7 = QGraphicsEffect::isEnabled(this->graphicsEffect);
      if (bVar7) {
        local_78.d = (QRegionData *)(double)QVar13.x1.m_i.m_i;
        local_70 = (double)QVar13.y1.m_i.m_i;
        local_68 = (double)(((long)QVar13.x2.m_i.m_i - (long)QVar13.x1.m_i.m_i) + 1);
        local_60 = (double)(((QVar13._8_8_ >> 0x20) - (QVar13._0_8_ >> 0x20)) + 1);
        (**(code **)(*(long *)this->graphicsEffect + 0x60))(local_58);
        QVar13 = (QRect)QRectF::toAlignedRect();
      }
    }
    local_58[0] = QVar13;
    QRegion::QRegion(&local_e0,local_58,Rectangle);
    pQVar3 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if ((pQVar3 == (QWExtra *)0x0) || ((pQVar3->field_0x7c & 0x80) == 0)) {
      QRegion::QRegion((QRegion *)local_58,&local_a8,Rectangle);
      QRegion::operator-=(&local_e0,(QRegion *)local_58);
      QRegion::~QRegion((QRegion *)local_58);
    }
    else {
      QVar13 = (QRect)QRect::operator&(&local_a8,(QRect *)local_98);
      local_58[0] = QVar13;
      QRegion::operator+=(&local_e0,local_58);
    }
    r = &local_e0;
    invalidateBackingStore<QRegion>(this_02,r);
    auVar14 = QRect::operator&(&local_a8,(QRect *)local_98);
    uVar4._0_4_ = (this->data).crect.x1;
    uVar4._4_4_ = (this->data).crect.y1;
    local_58[0]._0_8_ =
         (ulong)(uint)(auVar14._0_4_ - (undefined4)uVar4) |
         auVar14._0_8_ - (uVar4 & 0xffffffff00000000) & 0xffffffff00000000;
    local_58[0]._8_8_ =
         (ulong)(uint)(auVar14._8_4_ - (undefined4)uVar4) |
         auVar14._8_8_ - (uVar4 & 0xffffffff00000000) & 0xffffffff00000000;
    invalidateBackingStore<QRect>(this,local_58);
  }
  QRegion::~QRegion(r);
LAB_003194ed:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::moveRect(const QRect &rect, int dx, int dy)
{
    Q_Q(QWidget);
    if (!q->isVisible() || (dx == 0 && dy == 0))
        return;

    QWidget *tlw = q->window();

    static const bool accelEnv = qEnvironmentVariableIntValue("QT_NO_FAST_MOVE") == 0;

    QWidget *parentWidget = q->parentWidget();
    QPoint toplevelOffset = parentWidget->mapTo(tlw, QPoint());
    QWidgetPrivate *parentPrivate = parentWidget->d_func();
    const QRect clipR(parentPrivate->clipRect());
    const QRect newRect(rect.translated(dx, dy));
    QRect destRect = rect.intersected(clipR);
    if (destRect.isValid())
        destRect = destRect.translated(dx, dy).intersected(clipR);
    const QRect sourceRect(destRect.translated(-dx, -dy));
    const QRect parentRect(rect & clipR);
    const bool nativeWithTextureChild = textureChildSeen && hasPlatformWindow(q);

    bool accelerateMove = accelEnv && isOpaque && !nativeWithTextureChild && sourceRect.isValid()
#if QT_CONFIG(graphicsview)
                          // No accelerate move for proxy widgets.
                          && !tlw->d_func()->extra->proxyWidget
#endif
                          && !isOverlapped(sourceRect) && !isOverlapped(destRect);

    if (!accelerateMove) {
        QRegion parentRegion(effectiveRectFor(parentRect));
        if (!extra || !extra->hasMask) {
            parentRegion -= newRect;
        } else {
            // invalidateBackingStore() excludes anything outside the mask
            parentRegion += newRect & clipR;
        }
        parentPrivate->invalidateBackingStore(parentRegion);
        invalidateBackingStore((newRect & clipR).translated(-data.crect.topLeft()));
    } else {
        QWidgetRepaintManager *repaintManager = QWidgetPrivate::get(tlw)->maybeRepaintManager();
        Q_ASSERT(repaintManager);
        QRegion childExpose(newRect & clipR);

        if (repaintManager->bltRect(sourceRect, dx, dy, parentWidget))
            childExpose -= destRect;

        if (!parentWidget->updatesEnabled())
            return;

        const bool childUpdatesEnabled = q->updatesEnabled();

        if (childUpdatesEnabled && !childExpose.isEmpty()) {
            childExpose.translate(-data.crect.topLeft());
            repaintManager->markDirty(childExpose, q);
            isMoved = true;
        }

        QRegion parentExpose(parentRect);
        parentExpose -= newRect;
        if (extra && extra->hasMask)
            parentExpose += QRegion(newRect) - extra->mask.translated(data.crect.topLeft());

        if (!parentExpose.isEmpty()) {
            repaintManager->markDirty(parentExpose, parentWidget);
            parentPrivate->isMoved = true;
        }

        if (childUpdatesEnabled) {
            QRegion needsFlush(sourceRect);
            needsFlush += destRect;
            repaintManager->markNeedsFlush(parentWidget, needsFlush, toplevelOffset);
        }
    }
}